

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O2

void __thiscall
GdlBinaryExpression::FixFeatureTestsInRules(GdlBinaryExpression *this,GrcFont *pfont)

{
  bool bVar1;
  int iVar2;
  GdlLookupExpression *this_00;
  GdlFeatureDefn *this_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  GdlFeatureSetting *pGVar5;
  char *pcVar6;
  GdlExpression *pGVar7;
  allocator local_c4;
  allocator local_c3;
  allocator local_c2;
  bool fErr;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  GdlExpression *pGVar3;
  
  if (this->m_pexpOperand1 == (GdlExpression *)0x0) {
    this_00 = (GdlLookupExpression *)0x0;
  }
  else {
    this_00 = (GdlLookupExpression *)
              __dynamic_cast(this->m_pexpOperand1,&GdlExpression::typeinfo,
                             &GdlLookupExpression::typeinfo,0);
  }
  bVar1 = GrcSymbolTableEntry::IsComparativeOp(this->m_psymOperator);
  if ((this_00 != (GdlLookupExpression *)0x0 && bVar1) &&
     (bVar1 = GdlLookupExpression::NameFitsSymbolType(this_00,ksymtFeature), bVar1)) {
    this_01 = GrcSymbolTableEntry::FeatureDefnData(this_00->m_psymName);
    iVar2 = (*this->m_pexpOperand2->_vptr_GdlExpression[0xd])(this->m_pexpOperand2,this_01,&fErr);
    pGVar3 = (GdlExpression *)CONCAT44(extraout_var,iVar2);
    pGVar7 = this->m_pexpOperand2;
    if (pGVar3 != pGVar7) {
      if (pGVar7 != (GdlExpression *)0x0) {
        (*pGVar7->_vptr_GdlExpression[2])();
      }
      this->m_pexpOperand2 = pGVar3;
      pGVar7 = pGVar3;
    }
    iVar2 = (*pGVar7->_vptr_GdlExpression[0x10])(pGVar7,0xffff,pfont);
    pGVar3 = (GdlExpression *)CONCAT44(extraout_var_00,iVar2);
    pGVar7 = this->m_pexpOperand2;
    if (pGVar3 == pGVar7 || pGVar3 == (GdlExpression *)0x0) {
      pGVar3 = pGVar7;
      if (pGVar7 == (GdlExpression *)0x0) {
        return;
      }
    }
    else {
      if (pGVar7 != (GdlExpression *)0x0) {
        (*pGVar7->_vptr_GdlExpression[2])();
      }
      this->m_pexpOperand2 = pGVar3;
    }
    lVar4 = __dynamic_cast(pGVar3,&GdlExpression::typeinfo,&GdlNumericExpression::typeinfo,0);
    if (((lVar4 != 0) && (this_01->m_fStdLang == false)) &&
       (pGVar5 = GdlFeatureDefn::FindSettingWithValue(this_01,*(int *)(lVar4 + 0x34)),
       pGVar5 == (GdlFeatureSetting *)0x0)) {
      std::__cxx11::string::string((string *)&local_80,"Feature \'",&local_c2);
      std::__cxx11::string::string((string *)&local_a0,(string *)&this_01->m_staName);
      std::__cxx11::string::string((string *)&local_c0,"\' has no setting with value ",&local_c3);
      std::__cxx11::to_string(&local_40,*(int *)(lVar4 + 0x34));
      pcVar6 = "";
      if (-1 < *(int *)(lVar4 + 0x38)) {
        pcVar6 = "m";
      }
      std::__cxx11::string::string((string *)&local_60,pcVar6,&local_c4);
      GrcErrorList::AddWarning
                (&g_errorList,0x9d2,&(this->super_GdlExpression).super_GdlObject,&local_80,&local_a0
                 ,&local_c0,&local_40,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_80);
    }
    return;
  }
  (*this->m_pexpOperand1->_vptr_GdlExpression[0xc])(this->m_pexpOperand1,pfont);
  (*this->m_pexpOperand2->_vptr_GdlExpression[0xc])(this->m_pexpOperand2,pfont);
  return;
}

Assistant:

void GdlBinaryExpression::FixFeatureTestsInRules(GrcFont *pfont)
{

	GdlLookupExpression * pexplookFeature =
		dynamic_cast<GdlLookupExpression *>(m_pexpOperand1);

	if (m_psymOperator->IsComparativeOp() && pexplookFeature &&
		pexplookFeature->NameFitsSymbolType(ksymtFeature))
	{
		GdlFeatureDefn * pfeat = pexplookFeature->Name()->FeatureDefnData();
		Assert(pfeat);
		bool fErr;
		GdlExpression * pexpNew = m_pexpOperand2->ConvertFeatureSettingValue(pfeat, fErr);
		if (pexpNew != m_pexpOperand2)
		{
			delete m_pexpOperand2;
			m_pexpOperand2 = pexpNew;
		}

		pexpNew = m_pexpOperand2->SimplifyAndUnscale(0xFFFF, pfont);
		Assert(pexpNew);
		if (pexpNew && pexpNew != m_pexpOperand2)
		{
			delete m_pexpOperand2;
			m_pexpOperand2 = pexpNew;
		}

		GdlNumericExpression * pexpnum = dynamic_cast<GdlNumericExpression *>(m_pexpOperand2);
		if (pexpnum)
		{
			if (!pfeat->IsLanguageFeature())
			{
				GdlFeatureSetting * pfset = pfeat->FindSettingWithValue(pexpnum->Value());
				if (!pfset)
				{
					g_errorList.AddWarning(2514, this,
						"Feature '",
						pfeat->Name(),
						"' has no setting with value ",
						std::to_string(pexpnum->Value()),
						((pexpnum->m_munits >= kmunitDefault) ? "m" : ""));
				}
			}
		}
	}
	else
	{
		m_pexpOperand1->FixFeatureTestsInRules(pfont);
		m_pexpOperand2->FixFeatureTestsInRules(pfont);
	}
}